

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_subdiv.cpp
# Opt level: O3

Builder * embree::sse2::BVH4SubdivPatch1MBBuilderSAH(void *bvh,Scene *scene,size_t mode)

{
  long lVar1;
  Builder *pBVar2;
  __int_type_conflict _Var3;
  _func_int **pp_Var4;
  
  pBVar2 = (Builder *)alignedMalloc(0x70,0x40);
  (pBVar2->super_RefCount).refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  (pBVar2->super_RefCount)._vptr_RefCount =
       (_func_int **)&PTR__BVHNSubdivPatch1MBlurBuilderSAH_02191eb0;
  pBVar2[1].super_RefCount._vptr_RefCount = (_func_int **)bvh;
  pBVar2[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i =
       (__int_type_conflict)scene;
  lVar1 = *(long *)&(scene->super_AccelN).field_0x188;
  pp_Var4 = (_func_int **)(lVar1 + 0x550);
  if (lVar1 == 0) {
    pp_Var4 = (_func_int **)0x0;
  }
  pBVar2[2].super_RefCount._vptr_RefCount = pp_Var4;
  *(undefined1 *)&pBVar2[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  pBVar2[4].super_RefCount._vptr_RefCount = (_func_int **)0x0;
  pBVar2[3].super_RefCount._vptr_RefCount = (_func_int **)0x0;
  pBVar2[3].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  lVar1 = *(long *)&(scene->super_AccelN).field_0x188;
  _Var3 = lVar1 + 0x550;
  if (lVar1 == 0) {
    _Var3 = 0;
  }
  pBVar2[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = _Var3;
  *(undefined1 *)&pBVar2[5].super_RefCount._vptr_RefCount = 0;
  pBVar2[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  pBVar2[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i = 0;
  pBVar2[6].super_RefCount._vptr_RefCount = (_func_int **)0x0;
  return pBVar2;
}

Assistant:

Builder* BVH4SubdivPatch1MBBuilderSAH(void* bvh, Scene* scene, size_t mode) { return new BVHNSubdivPatch1MBlurBuilderSAH<4>((BVH4*)bvh,scene); }